

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar10;
  void *pvVar11;
  ulong uVar12;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar13;
  int iVar14;
  size_t checkpoint;
  secp256k1_scalar *s1_00;
  int *piVar15;
  secp256k1_gej *psVar16;
  long lVar17;
  secp256k1_ge *psVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  secp256k1_gej running_sum;
  int local_134;
  long local_128;
  long local_110;
  size_t local_e8;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  int local_40;
  
  bVar23 = 0;
  lVar9 = 0;
  do {
    iVar14 = (uint)scratch->magic[lVar9] - (uint)(byte)"scratch"[lVar9];
    if (scratch->magic[lVar9] != "scratch"[lVar9]) goto LAB_0016b71a;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  iVar14 = 0;
LAB_0016b71a:
  if (iVar14 == 0) {
    checkpoint = scratch->alloc_size;
  }
  else {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    checkpoint = 0;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  local_134 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar9 = n_points * 2 + 2;
    local_e8 = n_points;
    uVar7 = secp256k1_pippenger_bucket_window(n_points);
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar9 * 0x58);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar9 * 0x20);
    plVar10 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar10 == (long *)0x0 || s1 == (secp256k1_scalar *)0x0) || p1 == (secp256k1_ge *)0x0) {
      local_134 = 0;
    }
    else {
      pvVar11 = secp256k1_scratch_alloc(error_callback,scratch,lVar9 * 0x10);
      plVar10[1] = (long)pvVar11;
      local_134 = 0;
      uVar12 = (ulong)((int)(0x7f / (ulong)(uVar7 + 1)) + 1);
      pvVar11 = secp256k1_scratch_alloc(error_callback,scratch,lVar9 * uVar12 * 4);
      *plVar10 = (long)pvVar11;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x80L << ((byte)uVar7 & 0x3f));
      if ((plVar10[1] != 0) && (r_00 != (secp256k1_gej *)0x0 && *plVar10 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar9 = 0;
        }
        else {
          uVar4 = inp_g_sc->d[0];
          uVar5 = inp_g_sc->d[1];
          uVar6 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar6;
          s1->d[0] = uVar4;
          s1->d[1] = uVar5;
          psVar13 = &secp256k1_ge_const_g;
          psVar18 = p1;
          for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
            (psVar18->x).n[0] = (psVar13->x).n[0];
            psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar23 * -2 + 1) * 8);
            psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar23 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar9 = 2;
        }
        if (n_points != 0) {
          s1_00 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar9 << 5));
          psVar13 = p1 + lVar9;
          do {
            iVar14 = (*cb)(s1_00,psVar13,cb_offset,cbdata);
            if (iVar14 == 0) {
              local_134 = 0;
              goto LAB_0016bdc1;
            }
            secp256k1_ecmult_endo_split(s1_00,s1_00 + 1,psVar13,psVar13 + 1);
            lVar9 = lVar9 + 2;
            cb_offset = cb_offset + 1;
            s1_00 = s1_00 + 2;
            psVar13 = psVar13 + 2;
            local_e8 = local_e8 - 1;
          } while (local_e8 != 0);
        }
        if (lVar9 == 0) {
          local_110 = 0;
        }
        else {
          piVar15 = &p1->infinity;
          lVar19 = 0;
          local_110 = 0;
          psVar13 = p1;
          do {
            auVar24._0_4_ = -(uint)((int)s1->d[2] == 0 && (int)s1->d[0] == 0);
            auVar24._4_4_ =
                 -(uint)(*(int *)((long)s1->d + 0x14) == 0 && *(int *)((long)s1->d + 4) == 0);
            auVar24._8_4_ = -(uint)((int)s1->d[3] == 0 && (int)s1->d[1] == 0);
            auVar24._12_4_ =
                 -(uint)(*(int *)((long)s1->d + 0x1c) == 0 && *(int *)((long)s1->d + 0xc) == 0);
            uVar8 = movmskps((int)psVar13,auVar24);
            psVar13 = (secp256k1_ge *)(ulong)(uVar8 ^ 0xf);
            if (((uVar8 ^ 0xf) != 0) && (*piVar15 == 0)) {
              *(long *)(plVar10[1] + 8 + local_110 * 0x10) = lVar19;
              uVar8 = secp256k1_wnaf_fixed((int *)(local_110 * uVar12 * 4 + *plVar10),s1,uVar7 + 1);
              psVar13 = (secp256k1_ge *)(ulong)uVar8;
              *(uint *)(plVar10[1] + local_110 * 0x10) = uVar8;
              local_110 = local_110 + 1;
            }
            lVar19 = lVar19 + 1;
            piVar15 = piVar15 + 0x16;
            s1 = s1 + 1;
          } while (lVar9 != lVar19);
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
        local_134 = 1;
        if (local_110 != 0) {
          lVar17 = 1L << ((byte)uVar7 & 0x3f);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (ulong)uVar7 + 1;
          auVar3 = (ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar3;
          uVar21 = (ulong)(uint)(auVar3._0_4_ << 2);
          lVar9 = uVar21 + 4;
          uVar12 = (ulong)((int)lVar17 - 2);
          lVar19 = lVar17;
          psVar16 = r_00;
          local_128 = auVar3._0_8_;
          do {
            do {
              psVar16->infinity = 1;
              (psVar16->x).n[0] = 0;
              (psVar16->x).n[1] = 0;
              (psVar16->x).n[2] = 0;
              (psVar16->x).n[3] = 0;
              *(undefined1 (*) [16])((psVar16->x).n + 4) = (undefined1  [16])0x0;
              (psVar16->y).n[1] = 0;
              (psVar16->y).n[2] = 0;
              (psVar16->y).n[3] = 0;
              (psVar16->y).n[4] = 0;
              (psVar16->z).n[0] = 0;
              (psVar16->z).n[1] = 0;
              (psVar16->z).n[2] = 0;
              (psVar16->z).n[3] = 0;
              (psVar16->z).n[4] = 0;
              lVar19 = lVar19 + -1;
              psVar16 = psVar16 + 1;
            } while (lVar19 != 0);
            lVar22 = 8;
            uVar20 = uVar21;
            lVar19 = local_110;
            do {
              uVar8 = *(uint *)(*plVar10 + uVar20);
              lVar1 = *(long *)(plVar10[1] + lVar22);
              if ((local_128 == 0) && (*(int *)(plVar10[1] + -8 + lVar22) != 0)) {
                secp256k1_ge_neg((secp256k1_ge *)local_b8,p1 + lVar1);
                secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)local_b8,(secp256k1_fe *)0x0);
              }
              if ((int)uVar8 < 1) {
                if ((int)uVar8 < 0) {
                  uVar8 = ~uVar8;
                  psVar13 = (secp256k1_ge *)local_b8;
                  secp256k1_ge_neg(psVar13,p1 + lVar1);
                  goto LAB_0016bbd4;
                }
              }
              else {
                uVar8 = uVar8 - 1;
                psVar13 = p1 + lVar1;
LAB_0016bbd4:
                secp256k1_gej_add_ge_var
                          (r_00 + (uVar8 >> 1),r_00 + (uVar8 >> 1),psVar13,(secp256k1_fe *)0x0);
              }
              lVar22 = lVar22 + 0x10;
              uVar20 = uVar20 + lVar9;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar20 = (ulong)uVar7;
            do {
              if (r->infinity == 0) {
                secp256k1_gej_double(r,r);
              }
              else {
                r->infinity = 1;
                (r->x).n[0] = 0;
                (r->x).n[1] = 0;
                (r->x).n[2] = 0;
                (r->x).n[3] = 0;
                *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                (r->y).n[1] = 0;
                (r->y).n[2] = 0;
                (r->y).n[3] = 0;
                (r->y).n[4] = 0;
                (r->z).n[0] = 0;
                (r->z).n[1] = 0;
                (r->z).n[2] = 0;
                (r->z).n[3] = 0;
                (r->z).n[4] = 0;
              }
              uVar8 = (int)uVar20 - 1;
              uVar20 = (ulong)uVar8;
            } while (uVar8 != 0);
            local_40 = 1;
            local_b8._0_16_ = (undefined1  [16])0x0;
            local_b8._16_16_ = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_88 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            local_58 = (undefined1  [16])0x0;
            local_48 = 0;
            lVar19 = uVar12 + 2;
            psVar16 = r_00 + uVar12 + 1;
            do {
              secp256k1_gej_add_var
                        ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,psVar16,
                         (secp256k1_fe *)0x0);
              secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
              lVar19 = lVar19 + -1;
              psVar16 = psVar16 + -1;
            } while (1 < lVar19);
            secp256k1_gej_add_var
                      ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,r_00,(secp256k1_fe *)0x0)
            ;
            if (r->infinity == 0) {
              secp256k1_gej_double(r,r);
            }
            else {
              r->infinity = 1;
              (r->x).n[0] = 0;
              (r->x).n[1] = 0;
              (r->x).n[2] = 0;
              (r->x).n[3] = 0;
              *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
              (r->y).n[1] = 0;
              (r->y).n[2] = 0;
              (r->y).n[3] = 0;
              (r->y).n[4] = 0;
              (r->z).n[0] = 0;
              (r->z).n[1] = 0;
              (r->z).n[2] = 0;
              (r->z).n[3] = 0;
              (r->z).n[4] = 0;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
            uVar21 = uVar21 - 4;
            bVar2 = 0 < local_128;
            lVar19 = lVar17;
            psVar16 = r_00;
            local_128 = local_128 + -1;
          } while (bVar2);
        }
      }
    }
LAB_0016bdc1:
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
  }
  return local_134;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}